

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# complex_fft.c
# Opt level: O3

int WebRtcSpl_ComplexIFFT(int16_t *frfi,int stages,int mode)

{
  short sVar1;
  short sVar2;
  short sVar3;
  short sVar4;
  ulong uVar5;
  int16_t iVar6;
  int iVar7;
  ulong uVar8;
  sbyte sVar9;
  uint uVar10;
  byte bVar11;
  int iVar12;
  ulong uVar13;
  long lVar14;
  int iVar15;
  ulong uVar16;
  int iVar17;
  ulong uVar18;
  int iVar19;
  
  iVar7 = -1;
  if ((uint)stages < 0xb) {
    if (stages == 0) {
      iVar7 = 0;
    }
    else {
      uVar13 = (ulong)(1 << ((byte)stages & 0x1f));
      bVar11 = 9;
      iVar7 = 0;
      uVar18 = 1;
      do {
        iVar6 = (*WebRtcSpl_MaxAbsValueW16)(frfi,uVar13 * 2);
        sVar9 = 0x3505 < iVar6;
        uVar10 = (uint)(byte)sVar9;
        if (0x6a0a < iVar6) {
          sVar9 = 2;
        }
        iVar15 = uVar10 * 0x2000 + 0x2000 << (0x6a0a < iVar6);
        uVar5 = uVar18 * 2;
        if (mode == 0) {
          uVar8 = 0;
          do {
            if (uVar8 < uVar13) {
              lVar14 = uVar8 << (bVar11 & 0x3f);
              sVar1 = kSinTable1024[lVar14];
              sVar2 = kSinTable1024[lVar14 + 0x100];
              uVar16 = uVar8;
              do {
                iVar12 = (int)frfi[uVar18 * 2 + uVar16 * 2] * (int)sVar2 -
                         (int)frfi[uVar18 * 2 + uVar16 * 2 + 1] * (int)sVar1 >> 0xf;
                sVar3 = frfi[uVar16 * 2];
                iVar15 = (int)frfi[uVar18 * 2 + uVar16 * 2] * (int)sVar1 +
                         (int)frfi[uVar18 * 2 + uVar16 * 2 + 1] * (int)sVar2 >> 0xf;
                sVar4 = frfi[uVar16 * 2 + 1];
                frfi[uVar18 * 2 + uVar16 * 2] = (int16_t)(sVar3 - iVar12 >> sVar9);
                frfi[uVar18 * 2 + uVar16 * 2 + 1] = (int16_t)(sVar4 - iVar15 >> sVar9);
                frfi[uVar16 * 2] = (int16_t)(iVar12 + sVar3 >> sVar9);
                frfi[uVar16 * 2 + 1] = (int16_t)(iVar15 + sVar4 >> sVar9);
                uVar16 = uVar16 + uVar5;
              } while (uVar16 < uVar13);
            }
            uVar8 = uVar8 + 1;
          } while (uVar8 != uVar18 + (uVar18 == 0));
        }
        else {
          sVar9 = sVar9 + 0xe;
          uVar8 = 0;
          do {
            if (uVar8 < uVar13) {
              lVar14 = uVar8 << (bVar11 & 0x3f);
              sVar1 = kSinTable1024[lVar14];
              sVar2 = kSinTable1024[lVar14 + 0x100];
              uVar16 = uVar8;
              do {
                iVar12 = ((int)frfi[uVar18 * 2 + uVar16 * 2] * (int)sVar2 -
                         (int)sVar1 * (int)frfi[uVar18 * 2 + uVar16 * 2 + 1]) + 1 >> 1;
                iVar19 = (int)frfi[uVar18 * 2 + uVar16 * 2] * (int)sVar1 +
                         (int)frfi[uVar18 * 2 + uVar16 * 2 + 1] * (int)sVar2 + 1 >> 1;
                sVar3 = frfi[uVar16 * 2 + 1];
                iVar17 = frfi[uVar16 * 2] * 0x4000 + iVar15;
                frfi[uVar18 * 2 + uVar16 * 2] = (int16_t)(iVar17 - iVar12 >> sVar9);
                frfi[uVar18 * 2 + uVar16 * 2 + 1] =
                     (int16_t)((iVar15 - iVar19) + sVar3 * 0x4000 >> sVar9);
                frfi[uVar16 * 2] = (int16_t)(iVar17 + iVar12 >> sVar9);
                frfi[uVar16 * 2 + 1] = (int16_t)(iVar19 + iVar15 + sVar3 * 0x4000 >> sVar9);
                uVar16 = uVar16 + uVar5;
              } while (uVar16 < uVar13);
            }
            uVar8 = uVar8 + 1;
          } while (uVar8 != uVar18 + (uVar18 == 0));
        }
        iVar7 = iVar7 + uVar10 + (uint)(0x6a0a < iVar6);
        bVar11 = bVar11 - 1;
        uVar18 = uVar5;
      } while (uVar5 < uVar13);
    }
  }
  return iVar7;
}

Assistant:

int WebRtcSpl_ComplexIFFT(int16_t frfi[], int stages, int mode)
{
    size_t i, j, l, istep, n, m;
    int k, scale, shift;
    int16_t wr, wi;
    int32_t tr32, ti32, qr32, qi32;
    int32_t tmp32, round2;

    /* The 1024-value is a constant given from the size of kSinTable1024[],
     * and should not be changed depending on the input parameter 'stages'
     */
    n = 1 << stages;
    if (n > 1024)
        return -1;

    scale = 0;

    l = 1;
    k = 10 - 1; /* Constant for given kSinTable1024[]. Do not change
         depending on the input parameter 'stages' */

    while (l < n)
    {
        // variable scaling, depending upon data
        shift = 0;
        round2 = 8192;

        tmp32 = WebRtcSpl_MaxAbsValueW16(frfi, 2 * n);
        if (tmp32 > 13573)
        {
            shift++;
            scale++;
            round2 <<= 1;
        }
        if (tmp32 > 27146)
        {
            shift++;
            scale++;
            round2 <<= 1;
        }

        istep = l << 1;

        if (mode == 0)
        {
            // mode==0: Low-complexity and Low-accuracy mode
            for (m = 0; m < l; ++m)
            {
                j = m << k;

                /* The 256-value is a constant given as 1/4 of the size of
                 * kSinTable1024[], and should not be changed depending on the input
                 * parameter 'stages'. It will result in 0 <= j < N_SINE_WAVE/2
                 */
                wr = kSinTable1024[j + 256];
                wi = kSinTable1024[j];

                for (i = m; i < n; i += istep)
                {
                    j = i + l;

                    tr32 = (wr * frfi[2 * j] - wi * frfi[2 * j + 1]) >> 15;

                    ti32 = (wr * frfi[2 * j + 1] + wi * frfi[2 * j]) >> 15;

                    qr32 = (int32_t)frfi[2 * i];
                    qi32 = (int32_t)frfi[2 * i + 1];
                    frfi[2 * j] = (int16_t)((qr32 - tr32) >> shift);
                    frfi[2 * j + 1] = (int16_t)((qi32 - ti32) >> shift);
                    frfi[2 * i] = (int16_t)((qr32 + tr32) >> shift);
                    frfi[2 * i + 1] = (int16_t)((qi32 + ti32) >> shift);
                }
            }
        } else
        {
            // mode==1: High-complexity and High-accuracy mode

            for (m = 0; m < l; ++m)
            {
                j = m << k;

                /* The 256-value is a constant given as 1/4 of the size of
                 * kSinTable1024[], and should not be changed depending on the input
                 * parameter 'stages'. It will result in 0 <= j < N_SINE_WAVE/2
                 */
                wr = kSinTable1024[j + 256];
                wi = kSinTable1024[j];

#ifdef WEBRTC_ARCH_ARM_V7
                int32_t wri = 0;
                __asm __volatile("pkhbt %0, %1, %2, lsl #16" : "=r"(wri) :
                    "r"((int32_t)wr), "r"((int32_t)wi));
#endif

                for (i = m; i < n; i += istep)
                {
                    j = i + l;

#ifdef WEBRTC_ARCH_ARM_V7
                    register int32_t frfi_r;
                    __asm __volatile(
                      "pkhbt %[frfi_r], %[frfi_even], %[frfi_odd], lsl #16\n\t"
                      "smlsd %[tr32], %[wri], %[frfi_r], %[cifftrnd]\n\t"
                      "smladx %[ti32], %[wri], %[frfi_r], %[cifftrnd]\n\t"
                      :[frfi_r]"=&r"(frfi_r),
                       [tr32]"=&r"(tr32),
                       [ti32]"=r"(ti32)
                      :[frfi_even]"r"((int32_t)frfi[2*j]),
                       [frfi_odd]"r"((int32_t)frfi[2*j +1]),
                       [wri]"r"(wri),
                       [cifftrnd]"r"(CIFFTRND)
                    );
#else

                    tr32 = wr * frfi[2 * j] - wi * frfi[2 * j + 1] + CIFFTRND;

                    ti32 = wr * frfi[2 * j + 1] + wi * frfi[2 * j] + CIFFTRND;
#endif
                    tr32 >>= 15 - CIFFTSFT;
                    ti32 >>= 15 - CIFFTSFT;

                    qr32 = ((int32_t)frfi[2 * i]) << CIFFTSFT;
                    qi32 = ((int32_t)frfi[2 * i + 1]) << CIFFTSFT;

                    frfi[2 * j] = (int16_t)(
                        (qr32 - tr32 + round2) >> (shift + CIFFTSFT));
                    frfi[2 * j + 1] = (int16_t)(
                        (qi32 - ti32 + round2) >> (shift + CIFFTSFT));
                    frfi[2 * i] = (int16_t)(
                        (qr32 + tr32 + round2) >> (shift + CIFFTSFT));
                    frfi[2 * i + 1] = (int16_t)(
                        (qi32 + ti32 + round2) >> (shift + CIFFTSFT));
                }
            }

        }
        --k;
        l = istep;
    }
    return scale;
}